

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

void debugReportHighsSolution
               (string *message,HighsLogOptions *log_options,HighsInfo *highs_info,
               HighsModelStatus model_status)

{
  string local_38;
  
  highsLogDev(log_options,kInfo,"\nHiGHS solution: %s\n",(message->_M_dataplus)._M_p);
  if ((-1 < (highs_info->super_HighsInfoStruct).num_primal_infeasibilities) ||
     (-1 < (highs_info->super_HighsInfoStruct).num_dual_infeasibilities)) {
    highsLogDev(log_options,kInfo,"Infeas:                ");
    if (-1 < (highs_info->super_HighsInfoStruct).num_primal_infeasibilities) {
      highsLogDev(log_options,kInfo,"Pr %d(Max %.4g, Sum %.4g); ",
                  (highs_info->super_HighsInfoStruct).max_primal_infeasibility,
                  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities);
    }
    if (-1 < (highs_info->super_HighsInfoStruct).num_dual_infeasibilities) {
      highsLogDev(log_options,kInfo,"Du %d(Max %.4g, Sum %.4g); ",
                  (highs_info->super_HighsInfoStruct).max_dual_infeasibility,
                  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities);
    }
  }
  utilModelStatusToString_abi_cxx11_(&local_38,model_status);
  highsLogDev(log_options,kInfo,"Status: %s\n",local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void debugReportHighsSolution(const string message,
                              const HighsLogOptions& log_options,
                              const HighsInfo& highs_info,
                              const HighsModelStatus model_status) {
  highsLogDev(log_options, HighsLogType::kInfo, "\nHiGHS solution: %s\n",
              message.c_str());
  if (highs_info.num_primal_infeasibilities >= 0 ||
      highs_info.num_dual_infeasibilities >= 0) {
    highsLogDev(log_options, HighsLogType::kInfo, "Infeas:                ");
  }
  if (highs_info.num_primal_infeasibilities >= 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "Pr %" HIGHSINT_FORMAT "(Max %.4g, Sum %.4g); ",
                highs_info.num_primal_infeasibilities,
                highs_info.max_primal_infeasibility,
                highs_info.sum_primal_infeasibilities);
  }
  if (highs_info.num_dual_infeasibilities >= 0) {
    highsLogDev(log_options, HighsLogType::kInfo,
                "Du %" HIGHSINT_FORMAT "(Max %.4g, Sum %.4g); ",
                highs_info.num_dual_infeasibilities,
                highs_info.max_dual_infeasibility,
                highs_info.sum_dual_infeasibilities);
  }
  highsLogDev(log_options, HighsLogType::kInfo, "Status: %s\n",
              utilModelStatusToString(model_status).c_str());
}